

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O2

ssize_t __thiscall Excel::Record::read(Record *this,int __fd,void *__buf,size_t __nbytes)

{
  uint32_t *retVal;
  Record *pRVar1;
  int iVar2;
  uint uVar3;
  Exception *pEVar4;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Stream *this_00;
  ushort uVar5;
  ulong uVar6;
  uint16_t nextRecordCode;
  uint16_t nextRecordLength;
  allocator local_79;
  vector<char,_std::allocator<char>_> data;
  wstring local_60;
  Record *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  this_00 = (Stream *)CONCAT44(in_register_00000034,__fd);
  Stream::read<unsigned_short>(this_00,&this->m_code,2);
  retVal = &this->m_length;
  Stream::read<unsigned_int>(this_00,retVal,2);
  nextRecordCode = 0;
  nextRecordLength = 0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if ((ulong)this->m_length != 0) {
    std::vector<char,_std::allocator<char>_>::reserve(&data,(ulong)this->m_length);
    uVar6 = 0xffffffffffffffff;
    while (uVar6 = uVar6 + 1, uVar6 < *retVal) {
      iVar2 = (*this_00->_vptr_Stream[2])(this_00);
      local_60._M_dataplus._M_p._0_4_ = CONCAT31(local_60._M_dataplus._M_p._1_3_,(char)iVar2);
      std::vector<char,_std::allocator<char>_>::emplace_back<char>(&data,(char *)&local_60);
      iVar2 = (*this_00->_vptr_Stream[3])(this_00);
      if ((char)iVar2 != '\0') {
        pEVar4 = (Exception *)__cxa_allocate_exception(0x30);
        std::__cxx11::wstring::wstring((wstring *)&local_60,L"Unexpected end of file.",&local_79);
        Exception::Exception(pEVar4,&local_60);
        __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
      }
    }
  }
  Stream::read<unsigned_short>(this_00,&nextRecordCode,2);
  local_38 = &this->m_borders;
  local_40 = this;
  do {
    if (nextRecordCode != 0x3c) {
      iVar2 = (*this_00->_vptr_Stream[3])(this_00);
      pRVar1 = local_40;
      if ((char)iVar2 == '\0') {
        (*this_00->_vptr_Stream[4])(this_00,0xfffffffffffffffe,1);
      }
      if (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        std::ostream::write(&(pRVar1->m_stream).field_0x20,
                            (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start);
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&data.super__Vector_base<char,_std::allocator<char>_>);
      return extraout_RAX;
    }
    local_60._M_dataplus._M_p._0_4_ = *retVal;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_38,(int *)&local_60);
    Stream::read<unsigned_short>(this_00,&nextRecordLength,2);
    std::vector<char,_std::allocator<char>_>::reserve
              (&data,(size_type)
                     (data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish +
                     ((ulong)nextRecordLength -
                     (long)data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start)));
    if (nextRecordLength == 0) {
      uVar3 = 0;
    }
    else {
      uVar5 = 0xffff;
      while( true ) {
        uVar3 = (uint)nextRecordLength;
        uVar5 = uVar5 + 1;
        if (nextRecordLength <= uVar5) break;
        iVar2 = (*this_00->_vptr_Stream[2])(this_00);
        local_60._M_dataplus._M_p._0_4_ = CONCAT31(local_60._M_dataplus._M_p._1_3_,(char)iVar2);
        std::vector<char,_std::allocator<char>_>::emplace_back<char>(&data,(char *)&local_60);
        iVar2 = (*this_00->_vptr_Stream[3])(this_00);
        if ((char)iVar2 != '\0') {
          pEVar4 = (Exception *)__cxa_allocate_exception(0x30);
          std::__cxx11::wstring::wstring((wstring *)&local_60,L"Unexpected end of file.",&local_79);
          Exception::Exception(pEVar4,&local_60);
          __cxa_throw(pEVar4,&Exception::typeinfo,Exception::~Exception);
        }
      }
    }
    *retVal = *retVal + uVar3;
    Stream::read<unsigned_short>(this_00,&nextRecordCode,2);
  } while( true );
}

Assistant:

inline void
Record::read( Stream & stream )
{
	stream.read( m_code, 2 );
	stream.read( m_length, 2 );

	uint16_t nextRecordCode = 0;
	uint16_t nextRecordLength = 0;

	std::vector< char > data;

	if( m_length )
	{
		data.reserve( m_length );

		for( size_t i = 0; i < m_length; ++i )
		{
			data.push_back( stream.getByte() );

			if( stream.eof() )
				throw Exception( L"Unexpected end of file." );
		}
	}

	try {
		stream.read( nextRecordCode, 2 );
	}
	catch( const Exception & )
	{
		nextRecordCode = XL_UNKNOWN;
	}

	while( nextRecordCode == XL_CONTINUE )
	{
		m_borders.push_back( m_length );

		stream.read( nextRecordLength, 2 );

		data.reserve( data.size() + nextRecordLength );

		if( nextRecordLength )
		{
			for( uint16_t i = 0; i < nextRecordLength; ++i )
			{
				data.push_back( stream.getByte() );

				if( stream.eof() )
					throw Exception( L"Unexpected end of file." );
			}
		}

		m_length += nextRecordLength;

		try {
			stream.read( nextRecordCode, 2 );
		}
		catch( const Exception & )
		{
			nextRecordCode = XL_UNKNOWN;
		}
	}

	if( !stream.eof() )
		stream.seek( -2, Stream::FromCurrent );

	if( data.size() )
		m_stream.write( &data[ 0 ], data.size() );
}